

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O3

bool __thiscall llvm::convertUTF16ToUTF8String(llvm *this,ArrayRef<char> SrcBytes,string *Out)

{
  short sVar1;
  ConversionResult CVar2;
  ulong uVar3;
  ulong uVar4;
  long *plVar5;
  llvm *plVar6;
  bool bVar7;
  UTF16 *Src;
  UTF8 *Dst;
  vector<unsigned_short,_std::allocator<unsigned_short>_> ByteSwapped;
  llvm *local_58;
  UTF8 *local_50;
  llvm *local_48;
  long lStack_40;
  long local_38;
  
  plVar5 = (long *)SrcBytes.Length;
  if (plVar5[1] != 0) {
    __assert_fail("Out.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTFWrapper.cpp"
                  ,0x58,"bool llvm::convertUTF16ToUTF8String(ArrayRef<char>, std::string &)");
  }
  if (((undefined1  [16])SrcBytes & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (SrcBytes.Data == (char *)0x0) {
      bVar7 = true;
    }
    else {
      plVar6 = this + (long)SrcBytes.Data;
      local_48 = (llvm *)0x0;
      lStack_40 = 0;
      local_38 = 0;
      sVar1 = *(short *)this;
      local_58 = this;
      if (sVar1 == -2) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_range_insert<unsigned_short_const*>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_48,0);
        uVar3 = (ulong)(lStack_40 - (long)local_48) >> 1;
        if ((int)uVar3 != 0) {
          uVar4 = 0;
          do {
            plVar6 = local_48 + uVar4 * 2;
            *(ushort *)plVar6 = *(ushort *)plVar6 << 8 | *(ushort *)plVar6 >> 8;
            uVar4 = uVar4 + 1;
          } while ((uVar3 & 0xffffffff) != uVar4);
        }
        local_58 = local_48;
        plVar6 = local_48 + (lStack_40 - (long)local_48);
        sVar1 = *(short *)local_48;
      }
      if (sVar1 == -0x101) {
        local_58 = local_58 + 2;
      }
      std::__cxx11::string::resize((ulong)plVar5,(char)SrcBytes.Data * '\x04' + '\x01');
      local_50 = (UTF8 *)*plVar5;
      CVar2 = ConvertUTF16toUTF8((UTF16 **)&local_58,(UTF16 *)plVar6,&local_50,local_50 + plVar5[1],
                                 strictConversion);
      if (CVar2 == targetExhausted) {
        __assert_fail("CR != targetExhausted",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTFWrapper.cpp"
                      ,0x7b,"bool llvm::convertUTF16ToUTF8String(ArrayRef<char>, std::string &)");
      }
      bVar7 = CVar2 == conversionOK;
      if (bVar7) {
        std::__cxx11::string::resize((ulong)plVar5,(char)local_50 - (char)*plVar5);
        std::__cxx11::string::push_back((char)SrcBytes.Length);
        std::__cxx11::string::_M_erase((ulong)plVar5,plVar5[1] - 1);
      }
      else {
        plVar5[1] = 0;
        *(undefined1 *)*plVar5 = 0;
      }
      if (local_48 != (llvm *)0x0) {
        operator_delete(local_48,local_38 - (long)local_48);
      }
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool convertUTF16ToUTF8String(ArrayRef<char> SrcBytes, std::string &Out) {
  assert(Out.empty());

  // Error out on an uneven byte count.
  if (SrcBytes.size() % 2)
    return false;

  // Avoid OOB by returning early on empty input.
  if (SrcBytes.empty())
    return true;

  const UTF16 *Src = reinterpret_cast<const UTF16 *>(SrcBytes.begin());
  const UTF16 *SrcEnd = reinterpret_cast<const UTF16 *>(SrcBytes.end());

  // Byteswap if necessary.
  std::vector<UTF16> ByteSwapped;
  if (Src[0] == UNI_UTF16_BYTE_ORDER_MARK_SWAPPED) {
    ByteSwapped.insert(ByteSwapped.end(), Src, SrcEnd);
    for (unsigned I = 0, E = ByteSwapped.size(); I != E; ++I)
      ByteSwapped[I] = llvm::sys::SwapByteOrder_16(ByteSwapped[I]);
    Src = &ByteSwapped[0];
    SrcEnd = &ByteSwapped[ByteSwapped.size() - 1] + 1;
  }

  // Skip the BOM for conversion.
  if (Src[0] == UNI_UTF16_BYTE_ORDER_MARK_NATIVE)
    Src++;

  // Just allocate enough space up front.  We'll shrink it later.  Allocate
  // enough that we can fit a null terminator without reallocating.
  Out.resize(SrcBytes.size() * UNI_MAX_UTF8_BYTES_PER_CODE_POINT + 1);
  UTF8 *Dst = reinterpret_cast<UTF8 *>(&Out[0]);
  UTF8 *DstEnd = Dst + Out.size();

  ConversionResult CR =
      ConvertUTF16toUTF8(&Src, SrcEnd, &Dst, DstEnd, strictConversion);
  assert(CR != targetExhausted);

  if (CR != conversionOK) {
    Out.clear();
    return false;
  }

  Out.resize(reinterpret_cast<char *>(Dst) - &Out[0]);
  Out.push_back(0);
  Out.pop_back();
  return true;
}